

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_file.cpp
# Opt level: O2

void __thiscall
foxxll::mmap_file::serve
          (mmap_file *this,void *buffer,offset_type offset,size_type bytes,read_or_write op)

{
  int iVar1;
  void *__addr;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *piVar5;
  void *__src;
  string sStack_1e8;
  scoped_read_write_timer read_write_timer;
  unique_lock<std::mutex> fd_lock;
  ostringstream msg;
  
  std::unique_lock<std::mutex>::unique_lock(&fd_lock,&(this->super_ufs_file_base).fd_mutex_);
  file_stats::scoped_read_write_timer::scoped_read_write_timer
            (&read_write_timer,*(file_stats **)&this->field_0x88,bytes,op == WRITE);
  __addr = mmap64((void *)0x0,bytes,2 - (uint)(op == READ),1,(this->super_ufs_file_base).file_des_,
                  offset);
  if (__addr == (void *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar2 = std::operator<<((ostream *)&msg,"Error in ");
    poVar2 = std::operator<<(poVar2,
                             "virtual void foxxll::mmap_file::serve(void *, offset_type, size_type, request::read_or_write)"
                            );
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,"mmap() returned nullptr");
    poVar2 = std::operator<<(poVar2," : ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    piVar5 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::stringbuf::str();
    io_error::io_error(piVar5,&sStack_1e8);
    __cxa_throw(piVar5,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  if (__addr == (void *)0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar2 = std::operator<<((ostream *)&msg,"Error in ");
    poVar2 = std::operator<<(poVar2,
                             "virtual void foxxll::mmap_file::serve(void *, offset_type, size_type, request::read_or_write)"
                            );
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2," mmap() failed.");
    poVar2 = std::operator<<(poVar2," path=");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_ufs_file_base).filename_);
    poVar2 = std::operator<<(poVar2," bytes=");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," Page size: ");
    sysconf(0x1e);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2," offset modulo page size ");
    sysconf(0x1e);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," : ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    piVar5 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::stringbuf::str();
    io_error::io_error(piVar5,&sStack_1e8);
    __cxa_throw(piVar5,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  __src = __addr;
  if (op != READ) {
    __src = buffer;
    buffer = __addr;
  }
  memcpy(buffer,__src,bytes);
  iVar1 = munmap(__addr,bytes);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar2 = std::operator<<((ostream *)&msg,"Error in ");
    poVar2 = std::operator<<(poVar2,
                             "virtual void foxxll::mmap_file::serve(void *, offset_type, size_type, request::read_or_write)"
                            );
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,"munmap() failed");
    poVar2 = std::operator<<(poVar2," : ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    piVar5 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::stringbuf::str();
    io_error::io_error(piVar5,&sStack_1e8);
    __cxa_throw(piVar5,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  file_stats::scoped_read_write_timer::~scoped_read_write_timer(&read_write_timer);
  std::unique_lock<std::mutex>::~unique_lock(&fd_lock);
  return;
}

Assistant:

void mmap_file::serve(void* buffer, offset_type offset, size_type bytes,
                      request::read_or_write op)
{
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);

    //assert(offset + bytes <= _size());

    file_stats::scoped_read_write_timer read_write_timer(
        file_stats_, bytes, op == request::WRITE);

    int prot = (op == request::READ) ? PROT_READ : PROT_WRITE;
    void* mem = mmap(nullptr, bytes, prot, MAP_SHARED, file_des_, offset);

    if (mem == MAP_FAILED)
    {
        FOXXLL_THROW_ERRNO(
            io_error,
            " mmap() failed." <<
                " path=" << filename_ <<
                " bytes=" << bytes <<
                " Page size: " << sysconf(_SC_PAGESIZE) <<
                " offset modulo page size " << (offset % sysconf(_SC_PAGESIZE))
        );
    }
    else if (mem == 0)
    {
        FOXXLL_THROW_ERRNO(io_error, "mmap() returned nullptr");
    }
    else
    {
        if (op == request::READ)
        {
            memcpy(buffer, mem, bytes);
        }
        else
        {
            memcpy(mem, buffer, bytes);
        }
        FOXXLL_THROW_ERRNO_NE_0(
            munmap(mem, bytes), io_error,
            "munmap() failed"
        );
    }
}